

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  FuncDef *zP4;
  bool bVar1;
  int target;
  int iVar2;
  int iVar3;
  CollSeq *zP4_00;
  AggInfo_func *pAVar4;
  Expr **ppEVar5;
  ExprList_item *pEVar6;
  int nReg;
  bool bVar7;
  int local_5c;
  uint local_58;
  uint local_54;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  sqlite3ExprCacheClear(pParse);
  local_58 = 0;
  local_5c = 0;
  if (0 < pAggInfo->nFunc) {
    pAVar4 = pAggInfo->aFunc;
    iVar3 = 0;
    local_5c = 0;
    do {
      pList = (pAVar4->pExpr->x).pList;
      nReg = 0;
      target = 0;
      if (pList != (ExprList *)0x0) {
        nReg = pList->nExpr;
        if (pParse->nRangeReg < nReg) {
          target = pParse->nMem + 1;
          pParse->nMem = pParse->nMem + nReg;
        }
        else {
          target = pParse->iRangeReg;
          pParse->iRangeReg = target + nReg;
          pParse->nRangeReg = pParse->nRangeReg - nReg;
        }
        sqlite3ExprCodeExprList(pParse,pList,target,1);
      }
      if (pAVar4->iDistinct < 0) {
        local_54 = 0;
      }
      else {
        local_54 = sqlite3VdbeMakeLabel(p);
        codeDistinct(pParse,pAVar4->iDistinct,local_54,1,target);
      }
      if ((pAVar4->pFunc->flags & 8) != 0) {
        if (nReg < 1) {
          bVar7 = true;
          zP4_00 = (CollSeq *)0x0;
        }
        else {
          pEVar6 = pList->a;
          iVar2 = 1;
          do {
            zP4_00 = sqlite3ExprCollSeq(pParse,pEVar6->pExpr);
            bVar7 = zP4_00 == (CollSeq *)0x0;
            if (!bVar7) break;
            pEVar6 = pEVar6 + 1;
            bVar1 = iVar2 < nReg;
            iVar2 = iVar2 + 1;
          } while (bVar1);
        }
        if (bVar7) {
          zP4_00 = pParse->db->pDfltColl;
        }
        if (local_5c == 0) {
          if (pAggInfo->nAccumulator == 0) {
            local_5c = 0;
          }
          else {
            local_5c = pParse->nMem + 1;
            pParse->nMem = local_5c;
          }
        }
        iVar2 = sqlite3VdbeAddOp3(p,0x11,local_5c,0,0);
        sqlite3VdbeChangeP4(p,iVar2,(char *)zP4_00,-4);
      }
      zP4 = pAVar4->pFunc;
      iVar2 = sqlite3VdbeAddOp3(p,0x7b,0,target,pAVar4->iMem);
      sqlite3VdbeChangeP4(p,iVar2,(char *)zP4,-5);
      if (p->aOp != (Op *)0x0) {
        p->aOp[(long)p->nOp + -1].p5 = (u8)nReg;
      }
      sqlite3ExprCacheRemove(pParse,target,nReg);
      sqlite3ExprCacheRemove(pParse,target,nReg);
      if (pParse->nRangeReg < nReg) {
        pParse->nRangeReg = nReg;
        pParse->iRangeReg = target;
      }
      if (local_54 != 0) {
        if (p->aLabel != (int *)0x0) {
          p->aLabel[(int)~local_54] = p->nOp;
        }
        sqlite3ExprCacheClear(pParse);
      }
      iVar3 = iVar3 + 1;
      pAVar4 = pAVar4 + 1;
    } while (iVar3 < pAggInfo->nFunc);
  }
  if (local_5c != 0) {
    local_58 = sqlite3VdbeAddOp3(p,0x1b,local_5c,0,0);
  }
  sqlite3ExprCacheClear(pParse);
  if (0 < pAggInfo->nAccumulator) {
    ppEVar5 = &pAggInfo->aCol->pExpr;
    iVar3 = 0;
    do {
      sqlite3ExprCode(pParse,*ppEVar5,*(int *)((long)ppEVar5 + -4));
      iVar3 = iVar3 + 1;
      ppEVar5 = ppEVar5 + 4;
    } while (iVar3 < pAggInfo->nAccumulator);
  }
  pAggInfo->directMode = '\0';
  sqlite3ExprCacheClear(pParse);
  if ((0 < (int)local_58) && (local_58 < (uint)p->nOp)) {
    p->aOp[local_58].p2 = p->nOp;
  }
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  sqlite3ExprCacheClear(pParse);
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 1);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      assert( nArg==1 );
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->flags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp4(v, OP_AggStep, 0, regAgg, pF->iMem,
                      (void*)pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ExprCacheAffinityChange(pParse, regAgg, nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
      sqlite3ExprCacheClear(pParse);
    }
  }

  /* Before populating the accumulator registers, clear the column cache.
  ** Otherwise, if any of the required column values are already present 
  ** in registers, sqlite3ExprCode() may use OP_SCopy to copy the value
  ** to pC->iMem. But by the time the value is used, the original register
  ** may have been used, invalidating the underlying buffer holding the
  ** text or blob value. See ticket [883034dcb5].
  **
  ** Another solution would be to change the OP_SCopy used to copy cached
  ** values to an OP_Copy.
  */
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit);
  }
  sqlite3ExprCacheClear(pParse);
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  sqlite3ExprCacheClear(pParse);
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}